

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O1

void __thiscall dynet::AdamTrainer::update_lookup_params(AdamTrainer *this,real gscale,size_t idx)

{
  pointer ppLVar1;
  ParameterCollectionStorage *pPVar2;
  initializer_list<dynet::Tensor_*> __l;
  allocator_type local_4d;
  real local_4c;
  vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> local_48;
  Tensor *local_30;
  Tensor *local_28;
  pointer local_20;
  pointer local_18;
  
  local_4c = gscale;
  pPVar2 = ParameterCollection::get_storage((this->super_Trainer).model);
  ppLVar1 = (pPVar2->lookup_params).
            super__Vector_base<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_30 = &ppLVar1[idx]->all_values;
  local_28 = &ppLVar1[idx]->all_grads;
  local_20 = (this->lm).
             super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
             ._M_impl.super__Vector_impl_data._M_start + idx;
  local_18 = (this->lv).
             super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
             ._M_impl.super__Vector_impl_data._M_start + idx;
  __l._M_len = 4;
  __l._M_array = &local_30;
  std::vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::vector(&local_48,__l,&local_4d);
  (*(this->super_Trainer)._vptr_Trainer[5])(local_4c,this,&local_48);
  if (local_48.super__Vector_base<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void AdamTrainer::update_lookup_params(real gscale, size_t idx) {
  auto & p = model->lookup_parameters_list()[idx];
  update_rule(gscale, {&p->all_values, &p->all_grads, &lm[idx].all_h, &lv[idx].all_h});
}